

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O2

float __thiscall TC_parser<true>::featureValue(TC_parser<true> *this)

{
  char cVar1;
  char *pos;
  float fVar2;
  char *end_read;
  char *local_18;
  
  pos = this->reading_head;
  cVar1 = *pos;
  fVar2 = 1.0;
  if ((((cVar1 != '\t') && (cVar1 != ' ')) && (cVar1 != '|')) &&
     (cVar1 != '\r' && pos != this->endLine)) {
    if (cVar1 == ':') {
      this->reading_head = pos + 1;
      local_18 = (char *)0x0;
      fVar2 = parseFloat(pos + 1,&local_18,this->endLine);
      this->v = fVar2;
      if (local_18 == this->reading_head) {
        parserWarning(this,"malformed example! Float expected after : \"",this->beginLine,
                      this->reading_head,"\"");
        fVar2 = this->v;
      }
      if ((~(uint)fVar2 & 0x7fc00000) == 0) {
        this->v = 0.0;
        parserWarning(this,"warning: invalid feature value:\"",this->reading_head,local_18,
                      "\" read as NaN. Replacing with 0.");
        fVar2 = this->v;
      }
      this->reading_head = local_18;
    }
    else {
      parserWarning(this,"malformed example! \'|\', \':\', space, or EOL expected after : \"",
                    this->beginLine,pos,"\"");
      fVar2 = 0.0;
    }
  }
  return fVar2;
}

Assistant:

inline float featureValue()
  {
    if (*reading_head == ' ' || *reading_head == '\t' || *reading_head == '|' || reading_head == endLine ||
        *reading_head == '\r')
      return 1.;
    else if (*reading_head == ':')
    {
      // featureValue --> ':' 'Float'
      ++reading_head;
      char* end_read = nullptr;
      v = parseFloat(reading_head, &end_read, endLine);
      if (end_read == reading_head)
      {
        parserWarning("malformed example! Float expected after : \"", beginLine, reading_head, "\"");
      }
      if (nanpattern(v))
      {
        v = 0.f;
        parserWarning("warning: invalid feature value:\"", reading_head, end_read, "\" read as NaN. Replacing with 0.");
      }
      reading_head = end_read;
      return v;
    }
    else
    {
      // syntax error
      parserWarning("malformed example! '|', ':', space, or EOL expected after : \"", beginLine, reading_head, "\"");
      return 0.f;
    }
  }